

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles2::Performance::InvalidShaderCompilerCase::iterate(InvalidShaderCompilerCase *this)

{
  TestContext *this_00;
  code *pcVar1;
  int iVar2;
  bool bVar3;
  TestLog *this_01;
  size_type sVar4;
  reference pvVar5;
  deInt64 dVar6;
  char *pcVar7;
  MessageBuilder *pMVar8;
  int precision;
  float fVar9;
  float local_1f54;
  undefined4 local_1cfc;
  MessageBuilder local_1cf0;
  string local_1b70;
  float local_1b4c;
  undefined1 local_1b48 [4];
  float result;
  vector<long,_std::allocator<long>_> local_19c8;
  allocator<char> local_19a9;
  string local_19a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1988;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1968;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1948;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1928;
  LogNumber<float> local_1908;
  vector<long,_std::allocator<long>_> local_18a0;
  allocator<char> local_1881;
  string local_1880;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1860;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1840;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1800;
  LogNumber<float> local_17e0;
  vector<long,_std::allocator<long>_> local_1778;
  allocator<char> local_1759;
  string local_1758;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1718;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16d8;
  LogNumber<float> local_16b8;
  char *local_1650;
  MessageBuilder local_1648;
  float local_14c8;
  allocator<char> local_14c1;
  float rangeSizeRatio;
  string statNamePrefix_1;
  undefined1 local_1498 [3];
  bool isEntireRange_1;
  int entireRangeOrLowestHalf_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1478;
  LogSection local_1458;
  code *local_1418;
  VecFunc func;
  string plural;
  undefined1 local_13e8 [8];
  string singular;
  undefined1 local_13c0 [3];
  bool isMedian;
  int medianOrAverage;
  allocator<char> local_1239;
  string local_1238;
  allocator<char> local_1211;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11b0;
  LogNumber<float> local_1190;
  allocator<char> local_1121;
  string local_1120;
  allocator<char> local_10f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1098;
  LogNumber<float> local_1078;
  allocator<char> local_1009;
  string local_1008;
  allocator<char> local_fe1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f80;
  LogNumber<float> local_f60;
  allocator<char> local_ef1;
  string local_ef0;
  allocator<char> local_ec9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e68;
  LogNumber<float> local_e48;
  allocator<char> local_dd9;
  string local_dd8;
  allocator<char> local_db1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_db0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d50;
  LogNumber<float> local_d30;
  allocator<char> local_cc1;
  string local_cc0;
  allocator<char> local_c99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c38;
  LogNumber<float> local_c18;
  allocator<char> local_ba9;
  string local_ba8;
  allocator<char> local_b81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b20;
  LogNumber<float> local_b00;
  allocator<char> local_a91;
  string local_a90;
  allocator<char> local_a69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a08;
  LogNumber<float> local_9e8;
  allocator<char> local_979;
  string local_978;
  allocator<char> local_951;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_950;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_930;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_910;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f0;
  LogNumber<float> local_8d0;
  allocator<char> local_861;
  string local_860;
  allocator<char> local_839;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_838;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_818;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d8;
  LogNumber<float> local_7b8;
  char *local_750;
  MessageBuilder local_748;
  undefined1 local_5c8 [8];
  vector<long,_std::allocator<long>_> rangeTimes;
  undefined1 local_5a8 [8];
  string statNamePrefix;
  int local_580;
  bool isEntireRange;
  int entireRangeOrLowestHalf;
  string local_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  string local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  LogNumber<float> local_498;
  deInt64 local_430;
  int local_428;
  allocator<char> local_421;
  int ndx;
  allocator<char> local_3f9;
  string local_3f8;
  LogSection local_3d8;
  undefined1 local_398 [8];
  vector<long,_std::allocator<long>_> totalTimes;
  vector<long,_std::allocator<long>_> fragmentCompileTimes;
  vector<long,_std::allocator<long>_> vertexCompileTimes;
  vector<long,_std::allocator<long>_> sourceSetTimes;
  TestLog *log;
  Logs local_318;
  deUint64 local_2d8;
  deUint64 fragmentShaderCompileEndTime;
  deUint64 vertexShaderCompileEndTime;
  deUint64 shaderSourceSetEndTime;
  deUint64 startTime;
  BuildInfo buildInfo_1;
  Shaders shaders_1;
  ProgramContext progCtx_1;
  BuildInfo latestBuildInfo;
  ProgramContext latestProgramContext;
  vector<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
  measurements;
  Logs local_180;
  undefined1 local_140 [8];
  BuildInfo buildInfo;
  Shaders shaders;
  string local_d0;
  string local_a0;
  string local_80;
  undefined1 local_60 [8];
  ProgramContext progCtx;
  deUint32 specID;
  ShaderValidity shaderValidity;
  InvalidShaderCompilerCase *this_local;
  
  if (this->m_invalidityType == INVALIDITY_INVALID_CHAR) {
    local_1cfc = 1;
  }
  else {
    local_1cfc = 3;
    if (this->m_invalidityType == INVALIDITY_SEMANTIC_ERROR) {
      local_1cfc = 2;
    }
  }
  progCtx.fragShaderSource.field_2._12_4_ = local_1cfc;
  progCtx.fragShaderSource.field_2._8_4_ = getSpecializationID(this,0);
  ProgramContext::ProgramContext((ProgramContext *)local_60);
  singleVaryingVertexTemplate_abi_cxx11_();
  specializeShaderSource
            (&local_80,&local_a0,progCtx.fragShaderSource.field_2._8_4_,
             progCtx.fragShaderSource.field_2._12_4_);
  std::__cxx11::string::operator=((string *)local_60,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  singleVaryingFragmentTemplate_abi_cxx11_();
  specializeShaderSource
            (&local_d0,(string *)&shaders,progCtx.fragShaderSource.field_2._8_4_,
             progCtx.fragShaderSource.field_2._12_4_);
  std::__cxx11::string::operator=
            ((string *)(progCtx.vertShaderSource.field_2._M_local_buf + 8),(string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&shaders);
  buildInfo.logs.frag.field_2._8_8_ = createShaders(this);
  setShaderSources(this,(Shaders *)((long)&buildInfo.logs.frag.field_2 + 8),
                   (ProgramContext *)local_60);
  BuildInfo::BuildInfo((BuildInfo *)local_140);
  local_140[0] = compileShader(this,buildInfo.logs.frag.field_2._8_4_);
  local_140[1] = compileShader(this,buildInfo.logs.frag.field_2._12_4_);
  if (((local_140[0] & 1U) != 0) || (local_140[1])) {
    getLogs(&local_180,this,(Shaders *)((long)&buildInfo.logs.frag.field_2 + 8));
    Logs::operator=((Logs *)&buildInfo,&local_180);
    Logs::~Logs(&local_180);
    logProgramData(this,(BuildInfo *)local_140,(ProgramContext *)local_60);
    cleanup(this,(EVP_PKEY_CTX *)(buildInfo.logs.frag.field_2._M_local_buf + 8));
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Compilation of a shader erroneously succeeded");
    this_local._4_4_ = STOP;
    bVar3 = true;
  }
  else {
    cleanup(this,(EVP_PKEY_CTX *)(buildInfo.logs.frag.field_2._M_local_buf + 8));
    bVar3 = false;
  }
  BuildInfo::~BuildInfo((BuildInfo *)local_140);
  ProgramContext::~ProgramContext((ProgramContext *)local_60);
  if (bVar3) {
    return this_local._4_4_;
  }
  std::
  vector<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
  ::vector((vector<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
            *)((long)&latestProgramContext.fragShaderSource.field_2 + 8));
  ProgramContext::ProgramContext((ProgramContext *)((long)&latestBuildInfo.logs.frag.field_2 + 8));
  BuildInfo::BuildInfo((BuildInfo *)((long)&progCtx_1.fragShaderSource.field_2 + 8));
  while (bVar3 = goodEnoughMeasurements
                           (this,(vector<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                                  *)((long)&latestProgramContext.fragShaderSource.field_2 + 8)),
        ((bVar3 ^ 0xffU) & 1) != 0) {
    sVar4 = std::
            vector<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
            ::size((vector<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                    *)((long)&latestProgramContext.fragShaderSource.field_2 + 8));
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
              (&shaders_1,this,sVar4 & 0xffffffff);
    buildInfo_1.logs.frag.field_2._8_8_ = createShaders(this);
    BuildInfo::BuildInfo((BuildInfo *)&startTime);
    tcu::warmupCPU();
    shaderSourceSetEndTime = deGetMicroseconds();
    setShaderSources(this,(Shaders *)((long)&buildInfo_1.logs.frag.field_2 + 8),
                     (ProgramContext *)&shaders_1);
    vertexShaderCompileEndTime = deGetMicroseconds();
    startTime._0_1_ = compileShader(this,buildInfo_1.logs.frag.field_2._8_4_);
    fragmentShaderCompileEndTime = deGetMicroseconds();
    startTime._1_1_ = compileShader(this,buildInfo_1.logs.frag.field_2._12_4_);
    local_2d8 = deGetMicroseconds();
    getLogs(&local_318,this,(Shaders *)((long)&buildInfo_1.logs.frag.field_2 + 8));
    Logs::operator=((Logs *)&buildInfo_1,&local_318);
    Logs::~Logs(&local_318);
    if ((((byte)startTime & 1) == 0) && ((startTime._1_1_ & 1) == 0)) {
      cleanup(this,(EVP_PKEY_CTX *)(buildInfo_1.logs.frag.field_2._M_local_buf + 8));
      Measurement::Measurement
                ((Measurement *)&log,vertexShaderCompileEndTime - shaderSourceSetEndTime,
                 fragmentShaderCompileEndTime - vertexShaderCompileEndTime,
                 local_2d8 - fragmentShaderCompileEndTime);
      std::
      vector<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
      ::push_back((vector<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                   *)((long)&latestProgramContext.fragShaderSource.field_2 + 8),(value_type *)&log);
      BuildInfo::operator=
                ((BuildInfo *)((long)&progCtx_1.fragShaderSource.field_2 + 8),
                 (BuildInfo *)&startTime);
      ProgramContext::operator=
                ((ProgramContext *)((long)&latestBuildInfo.logs.frag.field_2 + 8),
                 (ProgramContext *)&shaders_1);
      tcu::TestContext::touchWatchdog
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      bVar3 = false;
    }
    else {
      logProgramData(this,(BuildInfo *)&startTime,(ProgramContext *)&shaders_1);
      cleanup(this,(EVP_PKEY_CTX *)(buildInfo_1.logs.frag.field_2._M_local_buf + 8));
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Compilation of a shader erroneously succeeded");
      this_local._4_4_ = STOP;
      bVar3 = true;
    }
    BuildInfo::~BuildInfo((BuildInfo *)&startTime);
    ProgramContext::~ProgramContext((ProgramContext *)&shaders_1);
    if (bVar3) goto LAB_01ae48cf;
  }
  this_01 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)
             &vertexCompileTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)
             &fragmentCompileTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)
             &totalTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<long,_std::allocator<long>_>::vector((vector<long,_std::allocator<long>_> *)local_398)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f8,"IterationMeasurements",&local_3f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndx,"Iteration measurements of compilation times",&local_421);
  tcu::LogSection::LogSection(&local_3d8,&local_3f8,(string *)&ndx);
  tcu::TestLog::operator<<(this_01,&local_3d8);
  tcu::LogSection::~LogSection(&local_3d8);
  std::__cxx11::string::~string((string *)&ndx);
  std::allocator<char>::~allocator(&local_421);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::allocator<char>::~allocator(&local_3f9);
  for (local_428 = 0; iVar2 = local_428,
      sVar4 = std::
              vector<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
              ::size((vector<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                      *)((long)&latestProgramContext.fragShaderSource.field_2 + 8)),
      iVar2 < (int)sVar4; local_428 = local_428 + 1) {
    pvVar5 = std::
             vector<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
             ::operator[]((vector<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                           *)((long)&latestProgramContext.fragShaderSource.field_2 + 8),
                          (long)local_428);
    std::vector<long,_std::allocator<long>_>::push_back
              ((vector<long,_std::allocator<long>_> *)
               &vertexCompileTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&pvVar5->sourceSetTime);
    pvVar5 = std::
             vector<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
             ::operator[]((vector<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                           *)((long)&latestProgramContext.fragShaderSource.field_2 + 8),
                          (long)local_428);
    std::vector<long,_std::allocator<long>_>::push_back
              ((vector<long,_std::allocator<long>_> *)
               &fragmentCompileTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&pvVar5->vertexCompileTime);
    pvVar5 = std::
             vector<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
             ::operator[]((vector<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                           *)((long)&latestProgramContext.fragShaderSource.field_2 + 8),
                          (long)local_428);
    std::vector<long,_std::allocator<long>_>::push_back
              ((vector<long,_std::allocator<long>_> *)
               &totalTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&pvVar5->fragmentCompileTime);
    pvVar5 = std::
             vector<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
             ::operator[]((vector<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                           *)((long)&latestProgramContext.fragShaderSource.field_2 + 8),
                          (long)local_428);
    local_430 = Measurement::totalTime(pvVar5);
    std::vector<long,_std::allocator<long>_>::push_back
              ((vector<long,_std::allocator<long>_> *)local_398,&local_430);
    de::toString<int>(&local_4f8,&local_428);
    std::operator+(&local_4d8,"Measurement",&local_4f8);
    std::operator+(&local_4b8,&local_4d8,"Time");
    de::toString<int>(&local_558,&local_428);
    std::operator+(&local_538,"Measurement ",&local_558);
    std::operator+(&local_518,&local_538," time");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&entireRangeOrLowestHalf,"ms",(allocator<char> *)&isEntireRange);
    pvVar5 = std::
             vector<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
             ::operator[]((vector<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                           *)((long)&latestProgramContext.fragShaderSource.field_2 + 8),
                          (long)local_428);
    dVar6 = Measurement::totalTime(pvVar5);
    tcu::LogNumber<float>::LogNumber
              (&local_498,&local_4b8,&local_518,(string *)&entireRangeOrLowestHalf,QP_KEY_TAG_TIME,
               (float)dVar6 / 1000.0);
    tcu::TestLog::operator<<(this_01,&local_498);
    tcu::LogNumber<float>::~LogNumber(&local_498);
    std::__cxx11::string::~string((string *)&entireRangeOrLowestHalf);
    std::allocator<char>::~allocator((allocator<char> *)&isEntireRange);
    std::__cxx11::string::~string((string *)&local_518);
    std::__cxx11::string::~string((string *)&local_538);
    std::__cxx11::string::~string((string *)&local_558);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::__cxx11::string::~string((string *)&local_4f8);
  }
  for (local_580 = 0; local_580 < 2; local_580 = local_580 + 1) {
    statNamePrefix.field_2._M_local_buf[0xf] = local_580 == 0;
    pcVar7 = "LowestHalf";
    if ((bool)statNamePrefix.field_2._M_local_buf[0xf]) {
      pcVar7 = "";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_5a8,pcVar7,
               (allocator<char> *)
               ((long)&rangeTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&rangeTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    if ((statNamePrefix.field_2._M_local_buf[0xf] & 1U) == 0) {
      vectorLowestPercentage<long>
                ((vector<long,_std::allocator<long>_> *)local_5c8,
                 (vector<long,_std::allocator<long>_> *)local_398,0.5);
    }
    else {
      std::vector<long,_std::allocator<long>_>::vector
                ((vector<long,_std::allocator<long>_> *)local_5c8,
                 (vector<long,_std::allocator<long>_> *)local_398);
    }
    tcu::TestLog::operator<<(&local_748,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<
                       (&local_748,(char (*) [27])"\nStatistics computed from ");
    local_750 = "only the lowest 50%";
    if ((statNamePrefix.field_2._M_local_buf[0xf] & 1U) != 0) {
      local_750 = "all";
    }
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_750);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [28])" of the above measurements:");
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_748);
    std::operator+(&local_7f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a8,
                   "TotalTime");
    std::operator+(&local_7d8,&local_7f8,"Median");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_838," of total time",&local_839);
    std::operator+(&local_818,"Median",&local_838);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_860,"ms",&local_861);
    fVar9 = vectorFloatMedian<long>((vector<long,_std::allocator<long>_> *)local_5c8);
    tcu::LogNumber<float>::LogNumber
              (&local_7b8,&local_7d8,&local_818,&local_860,QP_KEY_TAG_TIME,fVar9 / 1000.0);
    tcu::TestLog::operator<<(this_01,&local_7b8);
    tcu::LogNumber<float>::~LogNumber(&local_7b8);
    std::__cxx11::string::~string((string *)&local_860);
    std::allocator<char>::~allocator(&local_861);
    std::__cxx11::string::~string((string *)&local_818);
    std::__cxx11::string::~string((string *)&local_838);
    std::allocator<char>::~allocator(&local_839);
    std::__cxx11::string::~string((string *)&local_7d8);
    std::__cxx11::string::~string((string *)&local_7f8);
    std::operator+(&local_910,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a8,
                   "TotalTime");
    std::operator+(&local_8f0,&local_910,"Average");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_950," of total time",&local_951);
    std::operator+(&local_930,"Average",&local_950);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_978,"ms",&local_979);
    fVar9 = vectorFloatAverage<long>((vector<long,_std::allocator<long>_> *)local_5c8);
    tcu::LogNumber<float>::LogNumber
              (&local_8d0,&local_8f0,&local_930,&local_978,QP_KEY_TAG_TIME,fVar9 / 1000.0);
    tcu::TestLog::operator<<(this_01,&local_8d0);
    tcu::LogNumber<float>::~LogNumber(&local_8d0);
    std::__cxx11::string::~string((string *)&local_978);
    std::allocator<char>::~allocator(&local_979);
    std::__cxx11::string::~string((string *)&local_930);
    std::__cxx11::string::~string((string *)&local_950);
    std::allocator<char>::~allocator(&local_951);
    std::__cxx11::string::~string((string *)&local_8f0);
    std::__cxx11::string::~string((string *)&local_910);
    std::operator+(&local_a28,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a8,
                   "TotalTime");
    std::operator+(&local_a08,&local_a28,"Minimum");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a68," of total time",&local_a69);
    std::operator+(&local_a48,"Minimum",&local_a68);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a90,"ms",&local_a91);
    fVar9 = vectorFloatMinimum<long>((vector<long,_std::allocator<long>_> *)local_5c8);
    tcu::LogNumber<float>::LogNumber
              (&local_9e8,&local_a08,&local_a48,&local_a90,QP_KEY_TAG_TIME,fVar9 / 1000.0);
    tcu::TestLog::operator<<(this_01,&local_9e8);
    tcu::LogNumber<float>::~LogNumber(&local_9e8);
    std::__cxx11::string::~string((string *)&local_a90);
    std::allocator<char>::~allocator(&local_a91);
    std::__cxx11::string::~string((string *)&local_a48);
    std::__cxx11::string::~string((string *)&local_a68);
    std::allocator<char>::~allocator(&local_a69);
    std::__cxx11::string::~string((string *)&local_a08);
    std::__cxx11::string::~string((string *)&local_a28);
    std::operator+(&local_b40,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a8,
                   "TotalTime");
    std::operator+(&local_b20,&local_b40,"Maximum");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b80," of total time",&local_b81);
    std::operator+(&local_b60,"Maximum",&local_b80);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_ba8,"ms",&local_ba9);
    fVar9 = vectorFloatMaximum<long>((vector<long,_std::allocator<long>_> *)local_5c8);
    tcu::LogNumber<float>::LogNumber
              (&local_b00,&local_b20,&local_b60,&local_ba8,QP_KEY_TAG_TIME,fVar9 / 1000.0);
    tcu::TestLog::operator<<(this_01,&local_b00);
    tcu::LogNumber<float>::~LogNumber(&local_b00);
    std::__cxx11::string::~string((string *)&local_ba8);
    std::allocator<char>::~allocator(&local_ba9);
    std::__cxx11::string::~string((string *)&local_b60);
    std::__cxx11::string::~string((string *)&local_b80);
    std::allocator<char>::~allocator(&local_b81);
    std::__cxx11::string::~string((string *)&local_b20);
    std::__cxx11::string::~string((string *)&local_b40);
    std::operator+(&local_c58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a8,
                   "TotalTime");
    std::operator+(&local_c38,&local_c58,"MedianAbsoluteDeviation");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c98," of total time",&local_c99);
    std::operator+(&local_c78,"Median absolute deviation",&local_c98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_cc0,"ms",&local_cc1);
    fVar9 = vectorFloatMedianAbsoluteDeviation<long>
                      ((vector<long,_std::allocator<long>_> *)local_5c8);
    tcu::LogNumber<float>::LogNumber
              (&local_c18,&local_c38,&local_c78,&local_cc0,QP_KEY_TAG_TIME,fVar9 / 1000.0);
    tcu::TestLog::operator<<(this_01,&local_c18);
    tcu::LogNumber<float>::~LogNumber(&local_c18);
    std::__cxx11::string::~string((string *)&local_cc0);
    std::allocator<char>::~allocator(&local_cc1);
    std::__cxx11::string::~string((string *)&local_c78);
    std::__cxx11::string::~string((string *)&local_c98);
    std::allocator<char>::~allocator(&local_c99);
    std::__cxx11::string::~string((string *)&local_c38);
    std::__cxx11::string::~string((string *)&local_c58);
    std::operator+(&local_d70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a8,
                   "TotalTime");
    std::operator+(&local_d50,&local_d70,"RelativeMedianAbsoluteDeviation");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_db0," of total time",&local_db1);
    std::operator+(&local_d90,"Relative median absolute deviation",&local_db0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_dd8,"",&local_dd9);
    fVar9 = vectorFloatRelativeMedianAbsoluteDeviation<long>
                      ((vector<long,_std::allocator<long>_> *)local_5c8);
    tcu::LogNumber<float>::LogNumber
              (&local_d30,&local_d50,&local_d90,&local_dd8,QP_KEY_TAG_NONE,fVar9);
    tcu::TestLog::operator<<(this_01,&local_d30);
    tcu::LogNumber<float>::~LogNumber(&local_d30);
    std::__cxx11::string::~string((string *)&local_dd8);
    std::allocator<char>::~allocator(&local_dd9);
    std::__cxx11::string::~string((string *)&local_d90);
    std::__cxx11::string::~string((string *)&local_db0);
    std::allocator<char>::~allocator(&local_db1);
    std::__cxx11::string::~string((string *)&local_d50);
    std::__cxx11::string::~string((string *)&local_d70);
    std::operator+(&local_e88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a8,
                   "TotalTime");
    std::operator+(&local_e68,&local_e88,"StandardDeviation");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ec8," of total time",&local_ec9);
    std::operator+(&local_ea8,"Standard deviation",&local_ec8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_ef0,"ms",&local_ef1);
    fVar9 = vectorFloatStandardDeviation<long>((vector<long,_std::allocator<long>_> *)local_5c8);
    tcu::LogNumber<float>::LogNumber
              (&local_e48,&local_e68,&local_ea8,&local_ef0,QP_KEY_TAG_TIME,fVar9 / 1000.0);
    tcu::TestLog::operator<<(this_01,&local_e48);
    tcu::LogNumber<float>::~LogNumber(&local_e48);
    std::__cxx11::string::~string((string *)&local_ef0);
    std::allocator<char>::~allocator(&local_ef1);
    std::__cxx11::string::~string((string *)&local_ea8);
    std::__cxx11::string::~string((string *)&local_ec8);
    std::allocator<char>::~allocator(&local_ec9);
    std::__cxx11::string::~string((string *)&local_e68);
    std::__cxx11::string::~string((string *)&local_e88);
    std::operator+(&local_fa0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a8,
                   "TotalTime");
    std::operator+(&local_f80,&local_fa0,"RelativeStandardDeviation");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_fe0," of total time",&local_fe1);
    std::operator+(&local_fc0,"Relative standard deviation",&local_fe0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1008,"",&local_1009);
    fVar9 = vectorFloatRelativeStandardDeviation<long>
                      ((vector<long,_std::allocator<long>_> *)local_5c8);
    tcu::LogNumber<float>::LogNumber
              (&local_f60,&local_f80,&local_fc0,&local_1008,QP_KEY_TAG_NONE,fVar9);
    tcu::TestLog::operator<<(this_01,&local_f60);
    tcu::LogNumber<float>::~LogNumber(&local_f60);
    std::__cxx11::string::~string((string *)&local_1008);
    std::allocator<char>::~allocator(&local_1009);
    std::__cxx11::string::~string((string *)&local_fc0);
    std::__cxx11::string::~string((string *)&local_fe0);
    std::allocator<char>::~allocator(&local_fe1);
    std::__cxx11::string::~string((string *)&local_f80);
    std::__cxx11::string::~string((string *)&local_fa0);
    std::operator+(&local_10b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a8,
                   "TotalTime");
    std::operator+(&local_1098,&local_10b8,"MaxMinusMin");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_10f8," of total time",&local_10f9);
    std::operator+(&local_10d8,"Max-min",&local_10f8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1120,"ms",&local_1121);
    fVar9 = vectorFloatMaximumMinusMinimum<long>((vector<long,_std::allocator<long>_> *)local_5c8);
    tcu::LogNumber<float>::LogNumber
              (&local_1078,&local_1098,&local_10d8,&local_1120,QP_KEY_TAG_TIME,fVar9 / 1000.0);
    tcu::TestLog::operator<<(this_01,&local_1078);
    tcu::LogNumber<float>::~LogNumber(&local_1078);
    std::__cxx11::string::~string((string *)&local_1120);
    std::allocator<char>::~allocator(&local_1121);
    std::__cxx11::string::~string((string *)&local_10d8);
    std::__cxx11::string::~string((string *)&local_10f8);
    std::allocator<char>::~allocator(&local_10f9);
    std::__cxx11::string::~string((string *)&local_1098);
    std::__cxx11::string::~string((string *)&local_10b8);
    std::operator+(&local_11d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a8,
                   "TotalTime");
    std::operator+(&local_11b0,&local_11d0,"RelativeMaxMinusMin");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1210," of total time",&local_1211);
    std::operator+(&local_11f0,"Relative max-min",&local_1210);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1238,"",&local_1239);
    fVar9 = vectorFloatRelativeMaximumMinusMinimum<long>
                      ((vector<long,_std::allocator<long>_> *)local_5c8);
    tcu::LogNumber<float>::LogNumber
              (&local_1190,&local_11b0,&local_11f0,&local_1238,QP_KEY_TAG_NONE,fVar9);
    tcu::TestLog::operator<<(this_01,&local_1190);
    tcu::LogNumber<float>::~LogNumber(&local_1190);
    std::__cxx11::string::~string((string *)&local_1238);
    std::allocator<char>::~allocator(&local_1239);
    std::__cxx11::string::~string((string *)&local_11f0);
    std::__cxx11::string::~string((string *)&local_1210);
    std::allocator<char>::~allocator(&local_1211);
    std::__cxx11::string::~string((string *)&local_11b0);
    std::__cxx11::string::~string((string *)&local_11d0);
    if (((statNamePrefix.field_2._M_local_buf[0xf] & 1U) == 0) &&
       (fVar9 = vectorFloatRelativeMedianAbsoluteDeviation<long>
                          ((vector<long,_std::allocator<long>_> *)local_5c8), 0.05 < fVar9)) {
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_13c0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar8 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_13c0,
                          (char (*) [85])
                          "\nWARNING: couldn\'t achieve relative median absolute deviation under threshold value "
                         );
      pMVar8 = tcu::MessageBuilder::operator<<
                         (pMVar8,(float *)&RELATIVE_MEDIAN_ABSOLUTE_DEVIATION_THRESHOLD);
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_13c0);
    }
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)local_5c8);
    std::__cxx11::string::~string((string *)local_5a8);
  }
  tcu::TestLog::operator<<(this_01,(EndSectionToken *)&tcu::TestLog::EndSection);
  for (singular.field_2._12_4_ = 0; (int)singular.field_2._12_4_ < 2;
      singular.field_2._12_4_ = singular.field_2._12_4_ + 1) {
    singular.field_2._M_local_buf[0xb] = singular.field_2._12_4_ == 0;
    pcVar7 = "Average";
    if ((bool)singular.field_2._M_local_buf[0xb]) {
      pcVar7 = "Median";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_13e8,pcVar7,(allocator<char> *)(plural.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(plural.field_2._M_local_buf + 0xf));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&func,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_13e8,
                   "s");
    local_1418 = vectorFloatAverage<long>;
    if ((singular.field_2._M_local_buf[0xb] & 1U) != 0) {
      local_1418 = vectorFloatMedian<long>;
    }
    std::operator+(&local_1478,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&func,
                   "PerPhase");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1498,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&func,
                   " per phase");
    tcu::LogSection::LogSection(&local_1458,&local_1478,(string *)local_1498);
    tcu::TestLog::operator<<(this_01,&local_1458);
    tcu::LogSection::~LogSection(&local_1458);
    std::__cxx11::string::~string((string *)local_1498);
    std::__cxx11::string::~string((string *)&local_1478);
    for (statNamePrefix_1.field_2._12_4_ = 0; (int)statNamePrefix_1.field_2._12_4_ < 2;
        statNamePrefix_1.field_2._12_4_ = statNamePrefix_1.field_2._12_4_ + 1) {
      statNamePrefix_1.field_2._M_local_buf[0xb] = statNamePrefix_1.field_2._12_4_ == 0;
      pcVar7 = "LowestHalf";
      if ((bool)statNamePrefix_1.field_2._M_local_buf[0xb]) {
        pcVar7 = "";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&rangeSizeRatio,pcVar7,&local_14c1);
      std::allocator<char>::~allocator(&local_14c1);
      local_1f54 = 1.0;
      if ((statNamePrefix_1.field_2._M_local_buf[0xb] & 1U) == 0) {
        local_1f54 = 0.5;
      }
      local_14c8 = local_1f54;
      tcu::TestLog::operator<<(&local_1648,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
      local_1650 = "\nFor only the lowest 50% of the measurements:";
      if ((statNamePrefix_1.field_2._M_local_buf[0xb] & 1U) != 0) {
        local_1650 = "For all measurements:";
      }
      pMVar8 = tcu::MessageBuilder::operator<<(&local_1648,&local_1650);
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1648);
      std::operator+(&local_16f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &rangeSizeRatio,"ShaderSourceSetTime");
      std::operator+(&local_16d8,&local_16f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_13e8
                    );
      std::operator+(&local_1738,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_13e8
                     ," of ");
      std::operator+(&local_1718,&local_1738,"shader source set time");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1758,"ms",&local_1759);
      pcVar1 = local_1418;
      vectorLowestPercentage<long>
                (&local_1778,
                 (vector<long,_std::allocator<long>_> *)
                 &vertexCompileTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,local_14c8);
      fVar9 = (float)(*pcVar1)(&local_1778);
      tcu::LogNumber<float>::LogNumber
                (&local_16b8,&local_16d8,&local_1718,&local_1758,QP_KEY_TAG_TIME,fVar9 / 1000.0);
      tcu::TestLog::operator<<(this_01,&local_16b8);
      tcu::LogNumber<float>::~LogNumber(&local_16b8);
      std::vector<long,_std::allocator<long>_>::~vector(&local_1778);
      std::__cxx11::string::~string((string *)&local_1758);
      std::allocator<char>::~allocator(&local_1759);
      std::__cxx11::string::~string((string *)&local_1718);
      std::__cxx11::string::~string((string *)&local_1738);
      std::__cxx11::string::~string((string *)&local_16d8);
      std::__cxx11::string::~string((string *)&local_16f8);
      std::operator+(&local_1820,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &rangeSizeRatio,"VertexShaderCompileTime");
      std::operator+(&local_1800,&local_1820,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_13e8
                    );
      std::operator+(&local_1860,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_13e8
                     ," of ");
      std::operator+(&local_1840,&local_1860,"vertex shader compile time");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1880,"ms",&local_1881);
      pcVar1 = local_1418;
      vectorLowestPercentage<long>
                (&local_18a0,
                 (vector<long,_std::allocator<long>_> *)
                 &fragmentCompileTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,local_14c8);
      fVar9 = (float)(*pcVar1)(&local_18a0);
      tcu::LogNumber<float>::LogNumber
                (&local_17e0,&local_1800,&local_1840,&local_1880,QP_KEY_TAG_TIME,fVar9 / 1000.0);
      tcu::TestLog::operator<<(this_01,&local_17e0);
      tcu::LogNumber<float>::~LogNumber(&local_17e0);
      std::vector<long,_std::allocator<long>_>::~vector(&local_18a0);
      std::__cxx11::string::~string((string *)&local_1880);
      std::allocator<char>::~allocator(&local_1881);
      std::__cxx11::string::~string((string *)&local_1840);
      std::__cxx11::string::~string((string *)&local_1860);
      std::__cxx11::string::~string((string *)&local_1800);
      std::__cxx11::string::~string((string *)&local_1820);
      std::operator+(&local_1948,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &rangeSizeRatio,"FragmentShaderCompileTime");
      std::operator+(&local_1928,&local_1948,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_13e8
                    );
      std::operator+(&local_1988,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_13e8
                     ," of ");
      std::operator+(&local_1968,&local_1988,"fragment shader compile time");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_19a8,"ms",&local_19a9);
      pcVar1 = local_1418;
      vectorLowestPercentage<long>
                (&local_19c8,
                 (vector<long,_std::allocator<long>_> *)
                 &totalTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,local_14c8);
      fVar9 = (float)(*pcVar1)(&local_19c8);
      tcu::LogNumber<float>::LogNumber
                (&local_1908,&local_1928,&local_1968,&local_19a8,QP_KEY_TAG_TIME,fVar9 / 1000.0);
      tcu::TestLog::operator<<(this_01,&local_1908);
      tcu::LogNumber<float>::~LogNumber(&local_1908);
      std::vector<long,_std::allocator<long>_>::~vector(&local_19c8);
      std::__cxx11::string::~string((string *)&local_19a8);
      std::allocator<char>::~allocator(&local_19a9);
      std::__cxx11::string::~string((string *)&local_1968);
      std::__cxx11::string::~string((string *)&local_1988);
      std::__cxx11::string::~string((string *)&local_1928);
      std::__cxx11::string::~string((string *)&local_1948);
      std::__cxx11::string::~string((string *)&rangeSizeRatio);
    }
    tcu::TestLog::operator<<(this_01,(EndSectionToken *)&tcu::TestLog::EndSection);
    std::__cxx11::string::~string((string *)&func);
    std::__cxx11::string::~string((string *)local_13e8);
  }
  tcu::TestLog::operator<<
            ((MessageBuilder *)local_1b48,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_1b48,
                      (char (*) [104])
                      "Note: test result is the first quartile (i.e. median of the lowest half of measurements) of total times"
                     );
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_1b48);
  local_1b4c = vectorFloatFirstQuartile<long>((vector<long,_std::allocator<long>_> *)local_398);
  local_1b4c = local_1b4c / 1000.0;
  this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  de::floatToString_abi_cxx11_(&local_1b70,(de *)0x2,local_1b4c,precision);
  pcVar7 = (char *)std::__cxx11::string::c_str();
  tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,pcVar7);
  std::__cxx11::string::~string((string *)&local_1b70);
  tcu::TestLog::operator<<(&local_1cf0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<
                     (&local_1cf0,
                      (char (*) [140])
                      "Note: the following shaders are the ones from the last iteration; variables\' names and some constant expressions differ between iterations."
                     );
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1cf0);
  logProgramData(this,(BuildInfo *)((long)&progCtx_1.fragShaderSource.field_2 + 8),
                 (ProgramContext *)((long)&latestBuildInfo.logs.frag.field_2 + 8));
  this_local._4_4_ = STOP;
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)local_398);
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)
             &totalTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)
             &fragmentCompileTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)
             &vertexCompileTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
LAB_01ae48cf:
  BuildInfo::~BuildInfo((BuildInfo *)((long)&progCtx_1.fragShaderSource.field_2 + 8));
  ProgramContext::~ProgramContext((ProgramContext *)((long)&latestBuildInfo.logs.frag.field_2 + 8));
  std::
  vector<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
  ::~vector((vector<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
             *)((long)&latestProgramContext.fragShaderSource.field_2 + 8));
  return this_local._4_4_;
}

Assistant:

InvalidShaderCompilerCase::IterateResult InvalidShaderCompilerCase::iterate (void)
{
	ShaderValidity shaderValidity = m_invalidityType == INVALIDITY_INVALID_CHAR		? SHADER_VALIDITY_INVALID_CHAR
								  : m_invalidityType == INVALIDITY_SEMANTIC_ERROR	? SHADER_VALIDITY_SEMANTIC_ERROR
								  : SHADER_VALIDITY_LAST;

	DE_ASSERT(shaderValidity != SHADER_VALIDITY_LAST);

	// Before actual measurements, compile a dummy shader to avoid possible initial slowdowns in the actual test.
	{
		deUint32		specID = getSpecializationID(0);
		ProgramContext	progCtx;
		progCtx.vertShaderSource = specializeShaderSource(singleVaryingVertexTemplate(), specID, shaderValidity);
		progCtx.fragShaderSource = specializeShaderSource(singleVaryingFragmentTemplate(), specID, shaderValidity);

		Shaders shaders = createShaders();
		setShaderSources(shaders, progCtx);

		BuildInfo buildInfo;
		buildInfo.vertCompileSuccess = compileShader(shaders.vertShader);
		buildInfo.fragCompileSuccess = compileShader(shaders.fragShader);
		if (buildInfo.vertCompileSuccess || buildInfo.fragCompileSuccess)
		{
			buildInfo.logs = getLogs(shaders);
			logProgramData(buildInfo, progCtx);
			cleanup(shaders);
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compilation of a shader erroneously succeeded");
			return STOP;
		}
		cleanup(shaders);
	}

	vector<Measurement>		measurements;
	// \note These are logged after measurements are done.
	ProgramContext			latestProgramContext;
	BuildInfo				latestBuildInfo;

	if (WARMUP_CPU_AT_BEGINNING_OF_CASE)
		tcu::warmupCPU();

	// Actual test measurements.
	while (!goodEnoughMeasurements(measurements))
	{
		// Create shader and compile. Measure time.

		// \note Shader sources are generated and GL shader objects are created before any time measurements.
		ProgramContext	progCtx		= generateShaderSources((int)measurements.size());
		Shaders			shaders		= createShaders();
		BuildInfo		buildInfo;

		if (WARMUP_CPU_BEFORE_EACH_MEASUREMENT)
			tcu::warmupCPU();

		// \note Do NOT do anything too hefty between the first and last deGetMicroseconds() here (other than the gl calls); it would disturb the measurement.

		deUint64 startTime = deGetMicroseconds();

		setShaderSources(shaders, progCtx);
		deUint64 shaderSourceSetEndTime = deGetMicroseconds();

		buildInfo.vertCompileSuccess = compileShader(shaders.vertShader);
		deUint64 vertexShaderCompileEndTime = deGetMicroseconds();

		buildInfo.fragCompileSuccess = compileShader(shaders.fragShader);
		deUint64 fragmentShaderCompileEndTime = deGetMicroseconds();

		buildInfo.logs = getLogs(shaders);

		// Both shader compilations should have failed.
		if (buildInfo.vertCompileSuccess || buildInfo.fragCompileSuccess)
		{
			logProgramData(buildInfo, progCtx);
			cleanup(shaders);
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compilation of a shader erroneously succeeded");
			return STOP;
		}

		// De-initializations (delete shaders).

		cleanup(shaders);

		// Output measurement log later (after last measurement).

		measurements.push_back(Measurement((deInt64)(shaderSourceSetEndTime			- startTime),
										   (deInt64)(vertexShaderCompileEndTime		- shaderSourceSetEndTime),
										   (deInt64)(fragmentShaderCompileEndTime	- vertexShaderCompileEndTime)));

		latestBuildInfo			= buildInfo;
		latestProgramContext	= progCtx;

		m_testCtx.touchWatchdog(); // \note Measurements may take a while in a bad case.
	}

	// End of test case, log information about measurements.
	{
		TestLog& log = m_testCtx.getLog();

		vector<deInt64> sourceSetTimes;
		vector<deInt64> vertexCompileTimes;
		vector<deInt64> fragmentCompileTimes;
		vector<deInt64> totalTimes;

		log << TestLog::Section("IterationMeasurements", "Iteration measurements of compilation times");

		for (int ndx = 0; ndx < (int)measurements.size(); ndx++)
		{
			sourceSetTimes.push_back		(measurements[ndx].sourceSetTime);
			vertexCompileTimes.push_back	(measurements[ndx].vertexCompileTime);
			fragmentCompileTimes.push_back	(measurements[ndx].fragmentCompileTime);
			totalTimes.push_back			(measurements[ndx].totalTime());

			// Log this measurement.
			log << TestLog::Float("Measurement" + de::toString(ndx) + "Time",
								  "Measurement " + de::toString(ndx) + " time",
								  "ms", QP_KEY_TAG_TIME, (float)measurements[ndx].totalTime()/1000.0f);
		}

		// Log some statistics.

		for (int entireRangeOrLowestHalf = 0; entireRangeOrLowestHalf < 2; entireRangeOrLowestHalf++)
		{
			bool				isEntireRange	= entireRangeOrLowestHalf == 0;
			string				statNamePrefix	= isEntireRange ? "" : "LowestHalf";
			vector<deInt64>		rangeTimes		= isEntireRange ? totalTimes : vectorLowestPercentage(totalTimes, 0.5f);

			log << TestLog::Message << "\nStatistics computed from "
									<< (isEntireRange ? "all" : "only the lowest 50%")
									<< " of the above measurements:"
									<< TestLog::EndMessage;

#define LOG_TIME_STAT(NAME, DESC, FUNC)			log << TestLog::Float(statNamePrefix + "TotalTime" + (NAME), (DESC) + string(" of total time"), "ms",	QP_KEY_TAG_TIME, (FUNC)(rangeTimes)/1000.0f)
#define LOG_RELATIVE_STAT(NAME, DESC, FUNC)		log << TestLog::Float(statNamePrefix + "TotalTime" + (NAME), (DESC) + string(" of total time"), "",		QP_KEY_TAG_NONE, (FUNC)(rangeTimes))

			LOG_TIME_STAT		("Median",							"Median",								vectorFloatMedian);
			LOG_TIME_STAT		("Average",							"Average",								vectorFloatAverage);
			LOG_TIME_STAT		("Minimum",							"Minimum",								vectorFloatMinimum);
			LOG_TIME_STAT		("Maximum",							"Maximum",								vectorFloatMaximum);
			LOG_TIME_STAT		("MedianAbsoluteDeviation",			"Median absolute deviation",			vectorFloatMedianAbsoluteDeviation);
			LOG_RELATIVE_STAT	("RelativeMedianAbsoluteDeviation",	"Relative median absolute deviation",	vectorFloatRelativeMedianAbsoluteDeviation);
			LOG_TIME_STAT		("StandardDeviation",				"Standard deviation",					vectorFloatStandardDeviation);
			LOG_RELATIVE_STAT	("RelativeStandardDeviation",		"Relative standard deviation",			vectorFloatRelativeStandardDeviation);
			LOG_TIME_STAT		("MaxMinusMin",						"Max-min",								vectorFloatMaximumMinusMinimum);
			LOG_RELATIVE_STAT	("RelativeMaxMinusMin",				"Relative max-min",						vectorFloatRelativeMaximumMinusMinimum);

#undef LOG_TIME_STAT
#undef LOG_RELATIVE_STAT

			if (!isEntireRange && vectorFloatRelativeMedianAbsoluteDeviation(rangeTimes) > RELATIVE_MEDIAN_ABSOLUTE_DEVIATION_THRESHOLD)
				log << TestLog::Message << "\nWARNING: couldn't achieve relative median absolute deviation under threshold value " << RELATIVE_MEDIAN_ABSOLUTE_DEVIATION_THRESHOLD << TestLog::EndMessage;
		}

		log << TestLog::EndSection; // End section IterationMeasurements

		for (int medianOrAverage = 0; medianOrAverage < 2; medianOrAverage++)
		{
			typedef float (*VecFunc)(const vector<deInt64>&);

			bool	isMedian						= medianOrAverage == 0;
			string	singular						= isMedian ? "Median" : "Average";
			string	plural							= singular + "s";
			VecFunc func							= isMedian ? (VecFunc) vectorFloatMedian<deInt64> : (VecFunc) vectorFloatAverage<deInt64>;

			log << TestLog::Section(plural + "PerPhase", plural + " per phase");

			for (int entireRangeOrLowestHalf = 0; entireRangeOrLowestHalf < 2; entireRangeOrLowestHalf++)
			{
				bool	isEntireRange	= entireRangeOrLowestHalf == 0;
				string	statNamePrefix	= isEntireRange ? "" : "LowestHalf";
				float	rangeSizeRatio	= isEntireRange ? 1.0f : 0.5f;

#define LOG_TIME(NAME, DESC, DATA) log << TestLog::Float(statNamePrefix + (NAME) + singular, singular + " of " + (DESC), "ms", QP_KEY_TAG_TIME, func(vectorLowestPercentage((DATA), rangeSizeRatio))/1000.0f);

				log << TestLog::Message << (isEntireRange ? "For all measurements:" : "\nFor only the lowest 50% of the measurements:") << TestLog::EndMessage;
				LOG_TIME("ShaderSourceSetTime",			"shader source set time",			sourceSetTimes);
				LOG_TIME("VertexShaderCompileTime",		"vertex shader compile time",		vertexCompileTimes);
				LOG_TIME("FragmentShaderCompileTime",	"fragment shader compile time",		fragmentCompileTimes);

#undef LOG_TIME
			}

			log << TestLog::EndSection;
		}

		// Set result.

		{
			log << TestLog::Message << "Note: test result is the first quartile (i.e. median of the lowest half of measurements) of total times" << TestLog::EndMessage;
			float result = vectorFloatFirstQuartile(totalTimes) / 1000.0f;
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::floatToString(result, 2).c_str());
		}

		// Log shaders.

		log << TestLog::Message << "Note: the following shaders are the ones from the last iteration; variables' names and some constant expressions differ between iterations." << TestLog::EndMessage;

		logProgramData(latestBuildInfo, latestProgramContext);

		return STOP;
	}
}